

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O0

void dumpDebugARanges(DWARFContext *DCtx,Data *Y)

{
  DataExtractor data;
  StringRef Data;
  bool bVar1;
  int iVar2;
  DWARFObject *pDVar3;
  undefined4 extraout_var;
  Header *pHVar4;
  reference pDVar5;
  size_t extraout_RDX;
  desc_iterator_range dVar6;
  undefined1 local_128 [8];
  ARangeDescriptor Desc;
  Descriptor Descriptor;
  __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
  __end2;
  __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
  __begin2;
  desc_iterator_range *__range2;
  ARange Range;
  undefined1 local_78 [8];
  DWARFDebugArangeSet Set;
  uint64_t Offset;
  undefined1 auStack_30 [8];
  DataExtractor ArangesData;
  Data *Y_local;
  DWARFContext *DCtx_local;
  
  ArangesData._16_8_ = Y;
  pDVar3 = llvm::DWARFContext::getDWARFObj(DCtx);
  iVar2 = (*pDVar3->_vptr_DWARFObject[0xc])();
  Data.Data._4_4_ = extraout_var;
  Data.Data._0_4_ = iVar2;
  bVar1 = llvm::DWARFContext::isLittleEndian(DCtx);
  Data.Length = extraout_RDX;
  llvm::DataExtractor::DataExtractor((DataExtractor *)auStack_30,Data,bVar1,'\0');
  Set.ArangeDescriptors.
  super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  llvm::DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)local_78);
  while( true ) {
    data.Data.Length = (size_t)ArangesData.Data.Data;
    data.Data.Data = (char *)auStack_30;
    data.IsLittleEndian = (undefined1)ArangesData.Data.Length;
    data.AddressSize = ArangesData.Data.Length._1_1_;
    data._18_6_ = ArangesData.Data.Length._2_6_;
    bVar1 = llvm::DWARFDebugArangeSet::extract
                      ((DWARFDebugArangeSet *)local_78,data,
                       (uint64_t *)
                       &Set.ArangeDescriptors.
                        super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    llvm::DWARFYAML::ARange::ARange((ARange *)&__range2);
    pHVar4 = llvm::DWARFDebugArangeSet::getHeader((DWARFDebugArangeSet *)local_78);
    llvm::DWARFYAML::InitialLength::setLength((InitialLength *)&__range2,(ulong)pHVar4->Length);
    pHVar4 = llvm::DWARFDebugArangeSet::getHeader((DWARFDebugArangeSet *)local_78);
    Range.Length.TotalLength64._0_2_ = pHVar4->Version;
    pHVar4 = llvm::DWARFDebugArangeSet::getHeader((DWARFDebugArangeSet *)local_78);
    Range.Length.TotalLength64._4_4_ = pHVar4->CuOffset;
    pHVar4 = llvm::DWARFDebugArangeSet::getHeader((DWARFDebugArangeSet *)local_78);
    Range.Version._0_1_ = pHVar4->AddrSize;
    pHVar4 = llvm::DWARFDebugArangeSet::getHeader((DWARFDebugArangeSet *)local_78);
    Range.Version._1_1_ = pHVar4->SegSize;
    dVar6 = llvm::DWARFDebugArangeSet::descriptors((DWARFDebugArangeSet *)local_78);
    __begin2 = dVar6.begin_iterator._M_current;
    __end2 = llvm::
             iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
             ::begin((iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
                      *)&__begin2);
    Descriptor.Length =
         (uint64_t)
         llvm::
         iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
         ::end((iterator_range<__gnu_cxx::__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>_>
                *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
                                  *)&Descriptor.Length);
      if (!bVar1) break;
      pDVar5 = __gnu_cxx::
               __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
               ::operator*(&__end2);
      Desc.Length = pDVar5->Address;
      Descriptor.Address = pDVar5->Length;
      llvm::yaml::Hex64::operator=((Hex64 *)local_128,&Desc.Length);
      Desc.Address.value = Descriptor.Address;
      std::
      vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
      ::push_back((vector<llvm::DWARFYAML::ARangeDescriptor,_std::allocator<llvm::DWARFYAML::ARangeDescriptor>_>
                   *)&Range.AddrSize,(value_type *)local_128);
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFDebugArangeSet::Descriptor_*,_std::vector<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>_>
      ::operator++(&__end2);
    }
    std::vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_>::push_back
              ((vector<llvm::DWARFYAML::ARange,_std::allocator<llvm::DWARFYAML::ARange>_> *)
               (ArangesData._16_8_ + 0x38),(value_type *)&__range2);
    llvm::DWARFYAML::ARange::~ARange((ARange *)&__range2);
  }
  llvm::DWARFDebugArangeSet::~DWARFDebugArangeSet((DWARFDebugArangeSet *)local_78);
  return;
}

Assistant:

void dumpDebugARanges(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  DataExtractor ArangesData(DCtx.getDWARFObj().getArangesSection(),
                            DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(ArangesData, &Offset)) {
    DWARFYAML::ARange Range;
    Range.Length.setLength(Set.getHeader().Length);
    Range.Version = Set.getHeader().Version;
    Range.CuOffset = Set.getHeader().CuOffset;
    Range.AddrSize = Set.getHeader().AddrSize;
    Range.SegSize = Set.getHeader().SegSize;
    for (auto Descriptor : Set.descriptors()) {
      DWARFYAML::ARangeDescriptor Desc;
      Desc.Address = Descriptor.Address;
      Desc.Length = Descriptor.Length;
      Range.Descriptors.push_back(Desc);
    }
    Y.ARanges.push_back(Range);
  }
}